

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O0

size_t skip_sep(LexState *ls)

{
  int iVar1;
  size_t sVar2;
  byte *pbVar3;
  size_t local_30;
  uint local_24;
  uint local_20;
  long lStack_18;
  int s;
  size_t count;
  LexState *ls_local;
  
  lStack_18 = 0;
  iVar1 = ls->current;
  save(ls,ls->current);
  sVar2 = ls->z->n;
  ls->z->n = sVar2 - 1;
  if (sVar2 == 0) {
    local_20 = luaZ_fill(ls->z);
  }
  else {
    pbVar3 = (byte *)ls->z->p;
    ls->z->p = (char *)(pbVar3 + 1);
    local_20 = (uint)*pbVar3;
  }
  ls->current = local_20;
  while (ls->current == 0x3d) {
    save(ls,ls->current);
    sVar2 = ls->z->n;
    ls->z->n = sVar2 - 1;
    if (sVar2 == 0) {
      local_24 = luaZ_fill(ls->z);
    }
    else {
      pbVar3 = (byte *)ls->z->p;
      ls->z->p = (char *)(pbVar3 + 1);
      local_24 = (uint)*pbVar3;
    }
    ls->current = local_24;
    lStack_18 = lStack_18 + 1;
  }
  if (ls->current == iVar1) {
    local_30 = lStack_18 + 2;
  }
  else {
    local_30 = (size_t)(int)(uint)(lStack_18 == 0);
  }
  return local_30;
}

Assistant:

static size_t skip_sep (LexState *ls) {
  size_t count = 0;
  int s = ls->current;
  lua_assert(s == '[' || s == ']');
  save_and_next(ls);
  while (ls->current == '=') {
    save_and_next(ls);
    count++;
  }
  return (ls->current == s) ? count + 2
         : (count == 0) ? 1
         : 0;
}